

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O1

void __thiscall QApplicationPrivate::initializeWidgetFontHash(QApplicationPrivate *this)

{
  long *plVar1;
  QHash<QByteArray,QFont> *this_00;
  QFont *args;
  size_t sVar2;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t extraout_RDX_02;
  size_t extraout_RDX_03;
  size_t extraout_RDX_04;
  size_t extraout_RDX_05;
  size_t extraout_RDX_06;
  size_t extraout_RDX_07;
  size_t extraout_RDX_08;
  size_t extraout_RDX_09;
  size_t extraout_RDX_10;
  size_t extraout_RDX_11;
  size_t extraout_RDX_12;
  size_t extraout_RDX_13;
  size_t extraout_RDX_14;
  size_t extraout_RDX_15;
  size_t extraout_RDX_16;
  size_t extraout_RDX_17;
  size_t extraout_RDX_18;
  size_t extraout_RDX_19;
  long in_FS_OFFSET;
  undefined1 auVar3 [16];
  iterator iVar4;
  QByteArray local_38;
  long local_20;
  
  plVar1 = QGuiApplicationPrivate::platform_theme;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (QGuiApplicationPrivate::platform_theme != (long *)0x0) {
    this_00 = (QHash<QByteArray,QFont> *)
              QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_app_fonts>_>::
              operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_app_fonts>_>
                          *)this);
    QHash<QByteArray,_QFont>::clear((QHash<QByteArray,_QFont> *)this_00);
    auVar3 = (**(code **)(*plVar1 + 0x58))(plVar1,1);
    sVar2 = auVar3._8_8_;
    if (auVar3._0_8_ != (QFont *)0x0) {
      local_38.d.d = (Data *)0x0;
      local_38.d.ptr = "QMenu";
      local_38.d.size = 5;
      iVar4 = QHash<QByteArray,QFont>::emplace<QFont_const&>(this_00,&local_38,auVar3._0_8_);
      sVar2 = iVar4.i.bucket;
      if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
          sVar2 = extraout_RDX;
        }
      }
    }
    auVar3 = (**(code **)(*plVar1 + 0x58))(plVar1,2,sVar2);
    sVar2 = auVar3._8_8_;
    if (auVar3._0_8_ != (QFont *)0x0) {
      local_38.d.d = (Data *)0x0;
      local_38.d.ptr = "QMenuBar";
      local_38.d.size = 8;
      iVar4 = QHash<QByteArray,QFont>::emplace<QFont_const&>(this_00,&local_38,auVar3._0_8_);
      sVar2 = iVar4.i.bucket;
      if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
          sVar2 = extraout_RDX_00;
        }
      }
    }
    auVar3 = (**(code **)(*plVar1 + 0x58))(plVar1,3,sVar2);
    sVar2 = auVar3._8_8_;
    if (auVar3._0_8_ != (QFont *)0x0) {
      local_38.d.d = (Data *)0x0;
      local_38.d.ptr = "QMenuItem";
      local_38.d.size = 9;
      iVar4 = QHash<QByteArray,QFont>::emplace<QFont_const&>(this_00,&local_38,auVar3._0_8_);
      sVar2 = iVar4.i.bucket;
      if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
          sVar2 = extraout_RDX_01;
        }
      }
    }
    auVar3 = (**(code **)(*plVar1 + 0x58))(plVar1,4,sVar2);
    sVar2 = auVar3._8_8_;
    if (auVar3._0_8_ != (QFont *)0x0) {
      local_38.d.d = (Data *)0x0;
      local_38.d.ptr = "QMessageBox";
      local_38.d.size = 0xb;
      iVar4 = QHash<QByteArray,QFont>::emplace<QFont_const&>(this_00,&local_38,auVar3._0_8_);
      sVar2 = iVar4.i.bucket;
      if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
          sVar2 = extraout_RDX_02;
        }
      }
    }
    auVar3 = (**(code **)(*plVar1 + 0x58))(plVar1,5,sVar2);
    sVar2 = auVar3._8_8_;
    if (auVar3._0_8_ != (QFont *)0x0) {
      local_38.d.d = (Data *)0x0;
      local_38.d.ptr = "QLabel";
      local_38.d.size = 6;
      iVar4 = QHash<QByteArray,QFont>::emplace<QFont_const&>(this_00,&local_38,auVar3._0_8_);
      sVar2 = iVar4.i.bucket;
      if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
          sVar2 = extraout_RDX_03;
        }
      }
    }
    auVar3 = (**(code **)(*plVar1 + 0x58))(plVar1,6,sVar2);
    sVar2 = auVar3._8_8_;
    if (auVar3._0_8_ != (QFont *)0x0) {
      local_38.d.d = (Data *)0x0;
      local_38.d.ptr = "QTipLabel";
      local_38.d.size = 9;
      iVar4 = QHash<QByteArray,QFont>::emplace<QFont_const&>(this_00,&local_38,auVar3._0_8_);
      sVar2 = iVar4.i.bucket;
      if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
          sVar2 = extraout_RDX_04;
        }
      }
    }
    auVar3 = (**(code **)(*plVar1 + 0x58))(plVar1,8,sVar2);
    sVar2 = auVar3._8_8_;
    if (auVar3._0_8_ != (QFont *)0x0) {
      local_38.d.d = (Data *)0x0;
      local_38.d.ptr = "QTitleBar";
      local_38.d.size = 9;
      iVar4 = QHash<QByteArray,QFont>::emplace<QFont_const&>(this_00,&local_38,auVar3._0_8_);
      sVar2 = iVar4.i.bucket;
      if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
          sVar2 = extraout_RDX_05;
        }
      }
    }
    auVar3 = (**(code **)(*plVar1 + 0x58))(plVar1,7,sVar2);
    sVar2 = auVar3._8_8_;
    if (auVar3._0_8_ != (QFont *)0x0) {
      local_38.d.d = (Data *)0x0;
      local_38.d.ptr = "QStatusBar";
      local_38.d.size = 10;
      iVar4 = QHash<QByteArray,QFont>::emplace<QFont_const&>(this_00,&local_38,auVar3._0_8_);
      sVar2 = iVar4.i.bucket;
      if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
          sVar2 = extraout_RDX_06;
        }
      }
    }
    auVar3 = (**(code **)(*plVar1 + 0x58))(plVar1,9,sVar2);
    sVar2 = auVar3._8_8_;
    if (auVar3._0_8_ != (QFont *)0x0) {
      local_38.d.d = (Data *)0x0;
      local_38.d.ptr = "QMdiSubWindowTitleBar";
      local_38.d.size = 0x15;
      iVar4 = QHash<QByteArray,QFont>::emplace<QFont_const&>(this_00,&local_38,auVar3._0_8_);
      sVar2 = iVar4.i.bucket;
      if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
          sVar2 = extraout_RDX_07;
        }
      }
    }
    auVar3 = (**(code **)(*plVar1 + 0x58))(plVar1,10,sVar2);
    sVar2 = auVar3._8_8_;
    if (auVar3._0_8_ != (QFont *)0x0) {
      local_38.d.d = (Data *)0x0;
      local_38.d.ptr = "QDockWidgetTitle";
      local_38.d.size = 0x10;
      iVar4 = QHash<QByteArray,QFont>::emplace<QFont_const&>(this_00,&local_38,auVar3._0_8_);
      sVar2 = iVar4.i.bucket;
      if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
          sVar2 = extraout_RDX_08;
        }
      }
    }
    auVar3 = (**(code **)(*plVar1 + 0x58))(plVar1,0xb,sVar2);
    sVar2 = auVar3._8_8_;
    if (auVar3._0_8_ != (QFont *)0x0) {
      local_38.d.d = (Data *)0x0;
      local_38.d.ptr = "QPushButton";
      local_38.d.size = 0xb;
      iVar4 = QHash<QByteArray,QFont>::emplace<QFont_const&>(this_00,&local_38,auVar3._0_8_);
      sVar2 = iVar4.i.bucket;
      if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
          sVar2 = extraout_RDX_09;
        }
      }
    }
    auVar3 = (**(code **)(*plVar1 + 0x58))(plVar1,0xc,sVar2);
    sVar2 = auVar3._8_8_;
    if (auVar3._0_8_ != (QFont *)0x0) {
      local_38.d.d = (Data *)0x0;
      local_38.d.ptr = "QCheckBox";
      local_38.d.size = 9;
      iVar4 = QHash<QByteArray,QFont>::emplace<QFont_const&>(this_00,&local_38,auVar3._0_8_);
      sVar2 = iVar4.i.bucket;
      if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
          sVar2 = extraout_RDX_10;
        }
      }
    }
    auVar3 = (**(code **)(*plVar1 + 0x58))(plVar1,0xd,sVar2);
    sVar2 = auVar3._8_8_;
    if (auVar3._0_8_ != (QFont *)0x0) {
      local_38.d.d = (Data *)0x0;
      local_38.d.ptr = "QRadioButton";
      local_38.d.size = 0xc;
      iVar4 = QHash<QByteArray,QFont>::emplace<QFont_const&>(this_00,&local_38,auVar3._0_8_);
      sVar2 = iVar4.i.bucket;
      if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
          sVar2 = extraout_RDX_11;
        }
      }
    }
    auVar3 = (**(code **)(*plVar1 + 0x58))(plVar1,0xe,sVar2);
    sVar2 = auVar3._8_8_;
    if (auVar3._0_8_ != (QFont *)0x0) {
      local_38.d.d = (Data *)0x0;
      local_38.d.ptr = "QToolButton";
      local_38.d.size = 0xb;
      iVar4 = QHash<QByteArray,QFont>::emplace<QFont_const&>(this_00,&local_38,auVar3._0_8_);
      sVar2 = iVar4.i.bucket;
      if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
          sVar2 = extraout_RDX_12;
        }
      }
    }
    auVar3 = (**(code **)(*plVar1 + 0x58))(plVar1,0xf,sVar2);
    sVar2 = auVar3._8_8_;
    if (auVar3._0_8_ != (QFont *)0x0) {
      local_38.d.d = (Data *)0x0;
      local_38.d.ptr = "QAbstractItemView";
      local_38.d.size = 0x11;
      iVar4 = QHash<QByteArray,QFont>::emplace<QFont_const&>(this_00,&local_38,auVar3._0_8_);
      sVar2 = iVar4.i.bucket;
      if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
          sVar2 = extraout_RDX_13;
        }
      }
    }
    auVar3 = (**(code **)(*plVar1 + 0x58))(plVar1,0x10,sVar2);
    sVar2 = auVar3._8_8_;
    if (auVar3._0_8_ != (QFont *)0x0) {
      local_38.d.d = (Data *)0x0;
      local_38.d.ptr = "QListView";
      local_38.d.size = 9;
      iVar4 = QHash<QByteArray,QFont>::emplace<QFont_const&>(this_00,&local_38,auVar3._0_8_);
      sVar2 = iVar4.i.bucket;
      if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
          sVar2 = extraout_RDX_14;
        }
      }
    }
    auVar3 = (**(code **)(*plVar1 + 0x58))(plVar1,0x11,sVar2);
    sVar2 = auVar3._8_8_;
    if (auVar3._0_8_ != (QFont *)0x0) {
      local_38.d.d = (Data *)0x0;
      local_38.d.ptr = "QHeaderView";
      local_38.d.size = 0xb;
      iVar4 = QHash<QByteArray,QFont>::emplace<QFont_const&>(this_00,&local_38,auVar3._0_8_);
      sVar2 = iVar4.i.bucket;
      if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
          sVar2 = extraout_RDX_15;
        }
      }
    }
    auVar3 = (**(code **)(*plVar1 + 0x58))(plVar1,0x12,sVar2);
    sVar2 = auVar3._8_8_;
    if (auVar3._0_8_ != (QFont *)0x0) {
      local_38.d.d = (Data *)0x0;
      local_38.d.ptr = "QListBox";
      local_38.d.size = 8;
      iVar4 = QHash<QByteArray,QFont>::emplace<QFont_const&>(this_00,&local_38,auVar3._0_8_);
      sVar2 = iVar4.i.bucket;
      if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
          sVar2 = extraout_RDX_16;
        }
      }
    }
    auVar3 = (**(code **)(*plVar1 + 0x58))(plVar1,0x13,sVar2);
    sVar2 = auVar3._8_8_;
    if (auVar3._0_8_ != (QFont *)0x0) {
      local_38.d.d = (Data *)0x0;
      local_38.d.ptr = "QComboMenuItem";
      local_38.d.size = 0xe;
      iVar4 = QHash<QByteArray,QFont>::emplace<QFont_const&>(this_00,&local_38,auVar3._0_8_);
      sVar2 = iVar4.i.bucket;
      if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
          sVar2 = extraout_RDX_17;
        }
      }
    }
    auVar3 = (**(code **)(*plVar1 + 0x58))(plVar1,0x14,sVar2);
    sVar2 = auVar3._8_8_;
    if (auVar3._0_8_ != (QFont *)0x0) {
      local_38.d.d = (Data *)0x0;
      local_38.d.ptr = "QComboLineEdit";
      local_38.d.size = 0xe;
      iVar4 = QHash<QByteArray,QFont>::emplace<QFont_const&>(this_00,&local_38,auVar3._0_8_);
      sVar2 = iVar4.i.bucket;
      if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
          sVar2 = extraout_RDX_18;
        }
      }
    }
    auVar3 = (**(code **)(*plVar1 + 0x58))(plVar1,0x15,sVar2);
    sVar2 = auVar3._8_8_;
    if (auVar3._0_8_ != (QFont *)0x0) {
      local_38.d.d = (Data *)0x0;
      local_38.d.ptr = "QSmallFont";
      local_38.d.size = 10;
      iVar4 = QHash<QByteArray,QFont>::emplace<QFont_const&>(this_00,&local_38,auVar3._0_8_);
      sVar2 = iVar4.i.bucket;
      if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
          sVar2 = extraout_RDX_19;
        }
      }
    }
    args = (QFont *)(**(code **)(*plVar1 + 0x58))(plVar1,0x16,sVar2);
    if (args != (QFont *)0x0) {
      local_38.d.d = (Data *)0x0;
      local_38.d.ptr = "QMiniFont";
      local_38.d.size = 9;
      QHash<QByteArray,QFont>::emplace<QFont_const&>(this_00,&local_38,args);
      if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QApplicationPrivate::initializeWidgetFontHash()
{
    const QPlatformTheme *theme = QGuiApplicationPrivate::platformTheme();
    if (!theme)
        return;
    FontHash *fontHash = app_fonts();
    fontHash->clear();

    if (const QFont *font = theme->font(QPlatformTheme::MenuFont))
        fontHash->insert(QByteArrayLiteral("QMenu"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::MenuBarFont))
        fontHash->insert(QByteArrayLiteral("QMenuBar"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::MenuItemFont))
        fontHash->insert(QByteArrayLiteral("QMenuItem"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::MessageBoxFont))
        fontHash->insert(QByteArrayLiteral("QMessageBox"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::LabelFont))
        fontHash->insert(QByteArrayLiteral("QLabel"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::TipLabelFont))
        fontHash->insert(QByteArrayLiteral("QTipLabel"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::TitleBarFont))
        fontHash->insert(QByteArrayLiteral("QTitleBar"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::StatusBarFont))
        fontHash->insert(QByteArrayLiteral("QStatusBar"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::MdiSubWindowTitleFont))
        fontHash->insert(QByteArrayLiteral("QMdiSubWindowTitleBar"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::DockWidgetTitleFont))
        fontHash->insert(QByteArrayLiteral("QDockWidgetTitle"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::PushButtonFont))
        fontHash->insert(QByteArrayLiteral("QPushButton"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::CheckBoxFont))
        fontHash->insert(QByteArrayLiteral("QCheckBox"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::RadioButtonFont))
        fontHash->insert(QByteArrayLiteral("QRadioButton"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::ToolButtonFont))
        fontHash->insert(QByteArrayLiteral("QToolButton"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::ItemViewFont))
        fontHash->insert(QByteArrayLiteral("QAbstractItemView"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::ListViewFont))
        fontHash->insert(QByteArrayLiteral("QListView"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::HeaderViewFont))
        fontHash->insert(QByteArrayLiteral("QHeaderView"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::ListBoxFont))
        fontHash->insert(QByteArrayLiteral("QListBox"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::ComboMenuItemFont))
        fontHash->insert(QByteArrayLiteral("QComboMenuItem"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::ComboLineEditFont))
        fontHash->insert(QByteArrayLiteral("QComboLineEdit"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::SmallFont))
        fontHash->insert(QByteArrayLiteral("QSmallFont"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::MiniFont))
        fontHash->insert(QByteArrayLiteral("QMiniFont"), *font);
}